

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O3

int run_ping_pong_test(void)

{
  int iVar1;
  undefined8 uVar2;
  
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (completed_pingers == 1) {
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_ping_pong_test_cold_1();
  }
  run_ping_pong_test_cold_2();
  tcp_pinger_new(1);
  run_ping_pong_test();
  return 0;
}

Assistant:

static int run_ping_pong_test(void) {
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(completed_pingers == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}